

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O2

void borg_init_3(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  char *pcVar3;
  char **ppcVar4;
  int16_t *piVar5;
  size_t sVar6;
  size_t sVar7;
  angband_constants *paVar8;
  wchar_t wVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  object hack;
  char buf [256];
  int16_t what [514];
  char *text [514];
  
  borg_items = (borg_item *)
               mem_zalloc(((ulong)z_info->quiver_size + (ulong)z_info->pack_size) * 0x388 + 0x2a60);
  borg_shops = (borg_shop *)mem_zalloc(0x2fb08);
  safe_items = (borg_item *)
               mem_zalloc(((ulong)z_info->quiver_size + (ulong)z_info->pack_size) * 0x388 + 0x2a60);
  safe_home = (borg_item *)mem_zalloc((ulong)z_info->store_inven_max * 0x388);
  safe_shops = (borg_shop *)mem_zalloc(0x2a640);
  wVar9 = L'\0';
  lVar11 = 0x2a0;
  for (uVar10 = 1; lVar12 = (long)wVar9, uVar10 < z_info->k_max; uVar10 = uVar10 + 1) {
    if ((*(long *)(k_info->flags + lVar11 + -0x80) != 0) &&
       (*(int *)(k_info->flags + lVar11 + -0x5c) != 0x23)) {
      _Var1 = flag_has_dbg(k_info->kind_flags + lVar11,2,4,"k_ptr->kind_flags","KF_INSTA_ART");
      if (!_Var1) {
        object_prep(&hack,(object_kind *)(k_info->flags + lVar11 + -0x80),L'\n',MINIMISE);
        hack.number = '\x02';
        object_desc(buf,0x100,&hack,99,player);
        pcVar3 = string_make(buf);
        text[lVar12] = pcVar3;
        what[lVar12] = (int16_t)uVar10;
        wVar9 = wVar9 + L'\x01';
        mem_free(hack.brands);
        mem_free(hack.slays);
        mem_free(hack.curses);
      }
    }
    lVar11 = lVar11 + 0x2a0;
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(text,what,wVar9);
  ppcVar4 = (char **)mem_zalloc((ulong)z_info->k_max << 3);
  uVar10 = 0;
  uVar13 = 0;
  borg_sv_plural_text = ppcVar4;
  if (L'\0' < wVar9) {
    uVar13 = (ulong)(uint)wVar9;
  }
  for (; uVar13 != uVar10; uVar10 = uVar10 + 1) {
    ppcVar4[what[uVar10]] = text[uVar10];
  }
  borg_plural_size = wVar9;
  borg_plural_text = (char **)mem_zalloc(lVar12 << 3);
  piVar5 = (int16_t *)mem_zalloc((long)borg_plural_size * 2);
  ppcVar4 = borg_plural_text;
  borg_plural_what = piVar5;
  for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
    ppcVar4[uVar10] = text[uVar10];
  }
  for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
    piVar5[uVar10] = what[uVar10];
  }
  wVar9 = L'\0';
  uVar10 = 1;
  lVar11 = 0x2a0;
  while( true ) {
    if (z_info->k_max <= uVar10) break;
    if ((*(long *)(k_info->flags + lVar11 + -0x80) != 0) &&
       (*(int *)(k_info->flags + lVar11 + -0x5c) != 0x23)) {
      _Var1 = flag_has_dbg(k_info->kind_flags + lVar11,2,4,"k_ptr->kind_flags","KF_INSTA_ART");
      if (!_Var1) {
        object_prep(&hack,(object_kind *)(k_info->flags + lVar11 + -0x80),L'\0',MINIMISE);
        hack.number = '\x01';
        object_desc(buf,0x100,&hack,99,player);
        pcVar3 = string_make(buf);
        text[wVar9] = pcVar3;
        what[wVar9] = (int16_t)uVar10;
        wVar9 = wVar9 + L'\x01';
        mem_free(hack.brands);
        mem_free(hack.slays);
        mem_free(hack.curses);
      }
    }
    uVar10 = uVar10 + 1;
    lVar11 = lVar11 + 0x2a0;
  }
  uVar10 = 1;
  lVar11 = 0x164;
  while( true ) {
    lVar12 = (long)wVar9;
    if (z_info->a_max <= uVar10) break;
    pcVar3 = *(char **)(a_info->flags + lVar11 + -0x6c);
    if (pcVar3 != (char *)0x0) {
      wVar2 = borg_lookup_kind(*(wchar_t *)(a_info->flags + lVar11 + -0x4c),
                               *(wchar_t *)(a_info->flags + lVar11 + -0x48));
      object_prep(&hack,k_info + wVar2,L'\n',MINIMISE);
      if (hack.known != (object *)0x0) {
        hack.number = '\x01';
        object_desc(buf,0x100,&hack,99,player);
        sVar6 = strlen(pcVar3);
        sVar7 = strlen(buf);
        buf[sVar7 - (long)((int)sVar6 + 1)] = '\0';
        pcVar3 = string_make(buf);
        text[lVar12] = pcVar3;
        what[lVar12] = (int16_t)wVar2;
        wVar9 = wVar9 + L'\x01';
      }
      mem_free(hack.brands);
      mem_free(hack.slays);
      mem_free(hack.curses);
    }
    uVar10 = uVar10 + 1;
    lVar11 = lVar11 + 0x140;
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(text,what,wVar9);
  borg_single_size = wVar9;
  borg_single_text = (char **)mem_zalloc(lVar12 << 3);
  piVar5 = (int16_t *)mem_zalloc((long)borg_single_size * 2);
  ppcVar4 = borg_single_text;
  uVar13 = 0;
  uVar10 = 0;
  borg_single_what = piVar5;
  if (L'\0' < wVar9) {
    uVar10 = (ulong)(uint)wVar9;
  }
  for (; uVar10 != uVar13; uVar13 = uVar13 + 1) {
    ppcVar4[uVar13] = text[uVar13];
  }
  for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
    piVar5[uVar13] = what[uVar13];
  }
  lVar11 = 0x140;
  wVar9 = L'\0';
  paVar8 = z_info;
  for (uVar10 = 1; uVar10 < paVar8->a_max; uVar10 = uVar10 + 1) {
    if (*(long *)(a_info->flags + lVar11 + -0x48) != 0) {
      strnfmt(buf,0x100," %s");
      pcVar3 = string_make(buf);
      text[wVar9] = pcVar3;
      what[wVar9] = (int16_t)uVar10;
      wVar9 = wVar9 + L'\x01';
      paVar8 = z_info;
    }
    lVar11 = lVar11 + 0x140;
  }
  ppcVar4 = (char **)mem_zalloc((ulong)paVar8->a_max << 3);
  uVar10 = 0;
  uVar13 = 0;
  borg_sv_art_text = ppcVar4;
  if (L'\0' < wVar9) {
    uVar13 = (ulong)(uint)wVar9;
  }
  for (; uVar13 != uVar10; uVar10 = uVar10 + 1) {
    ppcVar4[what[uVar10]] = text[uVar10];
  }
  lVar11 = 0x268;
  paVar8 = z_info;
  for (uVar10 = 1; lVar12 = (long)wVar9, uVar10 < paVar8->e_max; uVar10 = uVar10 + 1) {
    if (*(long *)(e_info->flags + lVar11 + -0x20) != 0) {
      strnfmt(buf,0x100," %s");
      pcVar3 = string_make(buf);
      text[lVar12] = pcVar3;
      what[lVar12] = (short)uVar10 + 0x100;
      wVar9 = wVar9 + L'\x01';
      paVar8 = z_info;
    }
    lVar11 = lVar11 + 0x260;
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(text,what,wVar9);
  borg_artego_size = wVar9;
  borg_artego_text = (char **)mem_zalloc(lVar12 << 3);
  piVar5 = (int16_t *)mem_zalloc((long)borg_artego_size * 2);
  ppcVar4 = borg_artego_text;
  uVar13 = 0;
  uVar10 = 0;
  borg_artego_what = piVar5;
  if (L'\0' < wVar9) {
    uVar10 = (ulong)(uint)wVar9;
  }
  for (; uVar10 != uVar13; uVar13 = uVar13 + 1) {
    ppcVar4[uVar13] = text[uVar13];
  }
  for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
    piVar5[uVar13] = what[uVar13];
  }
  return;
}

Assistant:

void borg_init_3(void)
{
    int     i, k, n;

    int     size;

    int16_t what[514];
    char*   text[514];

    char    buf[256];

    /*** Item/Ware arrays ***/

    /* Make the inventory array */
    borg_items = mem_zalloc(QUIVER_END * sizeof(borg_item));

    /* Make the stores in the town */
    borg_shops = mem_zalloc(9 * sizeof(borg_shop));

    /*** Item/Ware arrays (simulation) ***/

    /* Make the "safe" inventory array */
    safe_items = mem_zalloc(QUIVER_END * sizeof(borg_item));
    safe_home  = mem_zalloc(z_info->store_inven_max * sizeof(borg_item));

    /* Make the "safe" stores in the town */
    safe_shops = mem_zalloc(8 * sizeof(borg_shop));

    /*** Plural Object Templates ***/

    /* Start with no objects */
    size = 0;

    /* Analyze some "item kinds" */
    for (k = 1; k < z_info->k_max; k++) {
        struct object hack;

        /* Get the kind */
        struct object_kind* k_ptr = &k_info[k];

        /* Skip "empty" items */
        if (!k_ptr->name)
            continue;

        /* Skip "gold" objects */
        if (k_ptr->tval == TV_GOLD)
            continue;

        /* Skip "artifacts" */
        if (kf_has(k_ptr->kind_flags, KF_INSTA_ART))
            continue;

        /* Hack -- make an item */
        object_prep(&hack, &k_info[k], 10, MINIMISE);

        /* Describe a "plural" object */
        hack.number = 2;
        object_desc(buf, sizeof(buf), &hack,
            ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, player);

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;

        size++;

        mem_free(hack.brands);
        mem_free(hack.slays);
        mem_free(hack.curses);
    }

    /* Set the sort hooks */
    borg_sort_comp = borg_sort_comp_hook;
    borg_sort_swap = borg_sort_swap_hook;
    /* Sort */
    borg_sort(text, what, size);

    borg_sv_plural_text = mem_zalloc(z_info->k_max * sizeof(char*));
    for (i = 0; i < size; i++)
        borg_sv_plural_text[what[i]] = text[i];

    /* Save the size */
    borg_plural_size = size;

    /* Allocate the "item parsing arrays" (plurals) */
    borg_plural_text = mem_zalloc(borg_plural_size * sizeof(char*));
    borg_plural_what = mem_zalloc(borg_plural_size * sizeof(int16_t));

    /* Save the entries */
    for (i = 0; i < size; i++)
        borg_plural_text[i] = text[i];
    for (i = 0; i < size; i++)
        borg_plural_what[i] = what[i];

    /*** Singular Object Templates ***/

    /* Start with no objects */
    size = 0;

    /* Analyze some "item kinds" */
    for (k = 1; k < z_info->k_max; k++) {
        struct object hack;

        /* Get the kind */
        struct object_kind* k_ptr = &k_info[k];

        /* Skip "empty" items */
        if (!k_ptr->name)
            continue;

        /* Skip "dungeon terrain" objects */
        if (k_ptr->tval == TV_GOLD)
            continue;

        /* Skip "artifacts" */
        if (kf_has(k_ptr->kind_flags, KF_INSTA_ART))
            continue;

        /* Hack -- make an item */
        object_prep(&hack, &k_info[k], 0, MINIMISE);

        /* Describe a "singular" object */
        hack.number = 1;
        object_desc(buf, sizeof(buf), &hack,
            ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, player);

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;
        size++;

        mem_free(hack.brands);
        mem_free(hack.slays);
        mem_free(hack.curses);
    }

    /* Analyze the "INSTA_ART" items */
    for (i = 1; i < z_info->a_max; i++) {
        struct object    hack;

        struct artifact* a_ptr = &a_info[i];

        char*            name = (a_ptr->name);

        /* Skip "empty" items */
        if (!a_ptr->name)
            continue;

        /* Extract the k"ind" */
        k = borg_lookup_kind(a_ptr->tval, a_ptr->sval);

        /* Hack -- make an item */
        object_prep(&hack, &k_info[k], 10, MINIMISE);

        if (!hack.known) {
            mem_free(hack.brands);
            mem_free(hack.slays);
            mem_free(hack.curses);
            continue;
        }

        /* Save the index */
        /* hack.name1 = i; */

        /* Describe a "singular" object */
        hack.number = 1;
        object_desc(buf, sizeof(buf), &hack,
            ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, player);

        /* Extract the "suffix" length */
        n = strlen(name) + 1;

        /* Remove the "suffix" */
        buf[strlen(buf) - n] = '\0';

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;
        size++;

        mem_free(hack.brands);
        mem_free(hack.slays);
        mem_free(hack.curses);
    }

    /* Set the sort hooks */
    borg_sort_comp = borg_sort_comp_hook;
    borg_sort_swap = borg_sort_swap_hook;
    /* Sort */
    borg_sort(text, what, size);

    /* Save the size */
    borg_single_size = size;

    /* Allocate the "item parsing arrays" (plurals) */
    borg_single_text = mem_zalloc(borg_single_size * sizeof(char*));
    borg_single_what = mem_zalloc(borg_single_size * sizeof(int16_t));

    /* Save the entries */
    for (i = 0; i < size; i++)
        borg_single_text[i] = text[i];
    for (i = 0; i < size; i++)
        borg_single_what[i] = what[i];

    /*** Artifact and Ego-Item Parsers ***/

    /* No entries yet */
    size = 0;

    /* Collect the "artifact names" */
    for (k = 1; k < z_info->a_max; k++) {
        struct artifact* a_ptr = &a_info[k];

        /* Skip non-items */
        if (!a_ptr->name)
            continue;

        /* Extract a string */
        strnfmt(buf, sizeof(buf), " %s", (a_ptr->name));

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;
        size++;
    }

    borg_sv_art_text = mem_zalloc(z_info->a_max * sizeof(char*));
    for (i = 0; i < size; i++)
        borg_sv_art_text[what[i]] = text[i];

    /* Collect the "ego-item names" */
    for (k = 1; k < z_info->e_max; k++) {
        struct ego_item* e_ptr = &e_info[k];

        /* Skip non-items */
        if (!e_ptr->name)
            continue;

        /* Extract a string */
        strnfmt(buf, sizeof(buf), " %s", (e_ptr->name));

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k + 256;
        size++;
    }
    /* Set the sort hooks */
    borg_sort_comp = borg_sort_comp_hook;
    borg_sort_swap = borg_sort_swap_hook;

    /* Sort */
    borg_sort(text, what, size);

    /* Save the size */
    borg_artego_size = size;

    /* Allocate the "item parsing arrays" (plurals) */
    borg_artego_text = mem_zalloc(borg_artego_size * sizeof(char*));
    borg_artego_what = mem_zalloc(borg_artego_size * sizeof(int16_t));

    /* Save the entries */
    for (i = 0; i < size; i++)
        borg_artego_text[i] = text[i];
    for (i = 0; i < size; i++)
        borg_artego_what[i] = what[i];
}